

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundTableRef *ref)

{
  element_type *peVar1;
  undefined8 uVar2;
  BoundBaseTableRef *ref_00;
  InternalException *this_00;
  BoundTableRef *in_RDX;
  pointer *__ptr_1;
  pointer *__ptr;
  undefined1 local_68 [32];
  string local_48;
  
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  switch(in_RDX->type) {
  case BASE_TABLE:
    ref_00 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(in_RDX);
    CreatePlan((Binder *)ref,ref_00);
    break;
  case SUBQUERY:
    BoundTableRef::Cast<duckdb::BoundSubqueryRef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundSubqueryRef *)ref);
    break;
  case JOIN:
    BoundTableRef::Cast<duckdb::BoundJoinRef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundJoinRef *)ref);
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Unsupported bound table ref type (%s)","");
    EnumUtil::ToString<duckdb::TableReferenceType>(&local_48,in_RDX->type);
    InternalException::InternalException<std::__cxx11::string>(this_00,(string *)local_68,&local_48)
    ;
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case TABLE_FUNCTION:
    BoundTableRef::Cast<duckdb::BoundTableFunction>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundTableFunction *)ref);
    break;
  case EXPRESSION_LIST:
    BoundTableRef::Cast<duckdb::BoundExpressionListRef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundExpressionListRef *)ref);
    break;
  case CTE:
    BoundTableRef::Cast<duckdb::BoundCTERef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundCTERef *)ref);
    break;
  case EMPTY_FROM:
    BoundTableRef::Cast<duckdb::BoundEmptyTableRef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundEmptyTableRef *)ref);
    break;
  case PIVOT:
    BoundTableRef::Cast<duckdb::BoundPivotRef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundPivotRef *)ref);
    break;
  case COLUMN_DATA:
    BoundTableRef::Cast<duckdb::BoundColumnDataRef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundColumnDataRef *)ref);
    break;
  case DELIM_GET:
    BoundTableRef::Cast<duckdb::BoundDelimGetRef>(in_RDX);
    CreatePlan((Binder *)local_68,(BoundDelimGetRef *)ref);
  }
  uVar2 = local_68._0_8_;
  local_68._0_8_ = (element_type *)0x0;
  peVar1 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar2;
  if (peVar1 != (element_type *)0x0) {
    (**(code **)(*(long *)&(peVar1->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8)
    )();
  }
  if ((element_type *)local_68._0_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 8))();
  }
  if ((in_RDX->sample).
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl != (SampleOptions *)0x0) {
    make_uniq<duckdb::LogicalSample,duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((duckdb *)local_68,&in_RDX->sample,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)this);
    uVar2 = local_68._0_8_;
    local_68._0_8_ = (element_type *)0x0;
    peVar1 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar2;
    if (peVar1 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar1->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if ((element_type *)local_68._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundTableRef &ref) {
	unique_ptr<LogicalOperator> root;
	switch (ref.type) {
	case TableReferenceType::BASE_TABLE:
		root = CreatePlan(ref.Cast<BoundBaseTableRef>());
		break;
	case TableReferenceType::SUBQUERY:
		root = CreatePlan(ref.Cast<BoundSubqueryRef>());
		break;
	case TableReferenceType::JOIN:
		root = CreatePlan(ref.Cast<BoundJoinRef>());
		break;
	case TableReferenceType::TABLE_FUNCTION:
		root = CreatePlan(ref.Cast<BoundTableFunction>());
		break;
	case TableReferenceType::EMPTY_FROM:
		root = CreatePlan(ref.Cast<BoundEmptyTableRef>());
		break;
	case TableReferenceType::EXPRESSION_LIST:
		root = CreatePlan(ref.Cast<BoundExpressionListRef>());
		break;
	case TableReferenceType::COLUMN_DATA:
		root = CreatePlan(ref.Cast<BoundColumnDataRef>());
		break;
	case TableReferenceType::CTE:
		root = CreatePlan(ref.Cast<BoundCTERef>());
		break;
	case TableReferenceType::PIVOT:
		root = CreatePlan(ref.Cast<BoundPivotRef>());
		break;
	case TableReferenceType::DELIM_GET:
		root = CreatePlan(ref.Cast<BoundDelimGetRef>());
		break;
	case TableReferenceType::INVALID:
	default:
		throw InternalException("Unsupported bound table ref type (%s)", EnumUtil::ToString(ref.type));
	}
	// plan the sample clause
	if (ref.sample) {
		root = make_uniq<LogicalSample>(std::move(ref.sample), std::move(root));
	}
	return root;
}